

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O1

void ansv<unsigned_long,0,1,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  void *pvVar1;
  comm *comm_00;
  _Map_pointer pppVar2;
  _Map_pointer pppVar3;
  comm *comm_01;
  unsigned_long uVar4;
  _Elt_pointer ppVar5;
  _Elt_pointer ppVar6;
  _Map_pointer pppVar7;
  _Map_pointer pppVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  _Elt_pointer ppVar13;
  long lVar14;
  _Elt_pointer ppVar15;
  unsigned_long uVar16;
  unsigned_long uVar17;
  unsigned_long uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  pointer puVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1d8;
  ulong local_180;
  comm *local_178;
  _Elt_pointer local_170;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_160;
  _Elt_pointer local_158;
  _Elt_pointer local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  _Map_pointer local_130;
  pair<unsigned_long,_unsigned_long> local_120;
  ulong local_110;
  size_t local_108;
  size_type local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Map_pointer local_80;
  _Elt_pointer local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_70;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_50;
  
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_168 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_160 = right_nsv;
  local_158 = (_Elt_pointer)left_nsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1d8,0);
  local_100 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  uVar4 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_100,comm);
  lVar23 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar23 != 0) {
    lVar23 = lVar23 >> 3;
    local_180 = uVar4 - 1;
LAB_0013146b:
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar23 + -1] < ppVar5[-1].first) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0013146b;
        }
      }
      while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar23 + -1] != ppVar5[-1].first) break;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(local_180 + lVar23);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar23 + -1];
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  local_50.current._M_cur = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50.current._M_first = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_50.current._M_last = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_50.current._M_node = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_70.current._M_cur = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_70.current._M_first = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_70.current._M_last = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_70.current._M_node = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_148,&local_50,&local_70,(allocator_type *)&local_98);
  pvVar1 = *(void **)local_168;
  *(pointer *)local_168 =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_168 + 8) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_168 + 0x10) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  local_178 = comm;
  local_108 = nonsv;
  if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar3 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar2 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_170 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_180 = ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
              ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Map_pointer)0x0)) * 0x20;
  local_150 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  pppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_180 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 1, indexing_type = 0]"
                 );
  }
  for (; pppVar8 < pppVar3; pppVar8 = pppVar8 + 1) {
    operator_delete(pppVar8[1]);
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar5;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar2;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_150;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = local_170;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
LAB_00131725:
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar9] < ppVar5[-1].first) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_00131725;
        }
      }
      while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar9] != ppVar5[-1].first) break;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar9 + uVar4);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar9];
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)(in->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar6 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar15 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar9 = (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
          (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar25 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_170 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_130 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_80 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_168,*(undefined8 *)(local_168 + 8));
  pppVar3 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar2 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar23 = (long)ppVar5 - (long)local_170;
  local_170 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_110 = (local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar23 = (lVar23 >> 4) + ((long)ppVar15 - (long)ppVar6 >> 4) +
           (((uVar9 >> 3) - 1) + (ulong)bVar25) * 0x20;
  ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  comm_00 = local_178;
  if (lVar23 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 1, indexing_type = 0]"
                 );
  }
  for (; local_150 = ppVar5, local_178 = comm_00, pppVar8 < pppVar3; pppVar8 = pppVar8 + 1) {
    operator_delete(pppVar8[1]);
    ppVar5 = local_150;
    comm_00 = local_178;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar2;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_170;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_150;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = local_78;
  if (lVar23 + local_180 != *(long *)(local_168 + 8) - *(long *)local_168 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 1, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_148,&local_110,1,comm_00);
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,(long)comm_00->m_size,(value_type_conflict *)&local_b0,
             (allocator_type *)&local_f8);
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)comm_00->m_size,(value_type_conflict *)&local_f8,
             (allocator_type *)&local_c8);
  comm_01 = local_178;
  iVar12 = comm_00->m_rank;
  lVar23 = (long)iVar12;
  if (0 < lVar23) {
    uVar9 = *(ulong *)((long)local_148.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar23 * 8 + -8);
    lVar24 = lVar23;
    uVar16 = 0;
    do {
      lVar14 = lVar24 + -1;
      uVar10 = uVar16 + 1;
      if (uVar16 + 1 < local_180) {
        uVar10 = local_180;
      }
      puVar21 = (ulong *)(uVar16 * 0x10 + *(long *)local_168);
      uVar17 = uVar16 - 1;
      do {
        uVar18 = uVar10 - 1;
        if ((1 - uVar10) + uVar17 == -1) break;
        uVar20 = *puVar21;
        uVar18 = uVar17 + 1;
        puVar21 = puVar21 + 2;
        uVar17 = uVar18;
      } while (*(ulong *)((long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar14 * 8) <= uVar20);
      uVar10 = *(ulong *)((long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar14 * 8);
      iVar11 = 0x12;
      if (uVar10 <= uVar9) {
        *(unsigned_long *)
         ((long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar14 * 8) = (uVar18 - uVar16) + 1;
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar14] = uVar16;
        iVar11 = (uint)(*(ulong *)((long)local_148.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar14 * 8) <
                       local_110) << 4;
        uVar9 = uVar10;
      }
    } while (((iVar11 == 0x12) || (iVar11 == 0)) &&
            (bVar25 = 1 < lVar24, lVar24 = lVar14, uVar16 = uVar18, bVar25));
  }
  iVar11 = local_178->m_size;
  if ((iVar12 < iVar11 + -1) && (iVar12 + 1 < iVar11)) {
    lVar24 = *(long *)local_168;
    uVar9 = ((unsigned_long *)
            ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start + 8))[lVar23];
    lVar23 = lVar23 + 1;
    uVar10 = (*(long *)(local_168 + 8) - lVar24 >> 4) - 1;
    do {
      uVar20 = uVar10;
      if (local_180 < uVar10) {
        puVar21 = (ulong *)(uVar10 * 0x10 + lVar24);
        uVar19 = uVar10;
        do {
          uVar20 = uVar19;
          if (*puVar21 <
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar23]) break;
          uVar19 = uVar19 - 1;
          puVar21 = puVar21 + -2;
          uVar20 = local_180;
        } while (local_180 < uVar19);
      }
      uVar19 = local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar23];
      iVar12 = 0x17;
      if (uVar19 <= uVar9) {
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar23] = (uVar10 - uVar20) + 1;
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar23] = uVar20;
        iVar12 = 0;
        uVar9 = uVar19;
        if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar23] < local_110) {
          iVar12 = 0x15;
        }
      }
    } while (((iVar12 == 0x17) || (iVar12 == 0)) &&
            (lVar23 = lVar23 + 1, uVar10 = uVar20, iVar11 != (int)lVar23));
  }
  mxx::all2all<unsigned_long>(&local_f8,&local_98,local_178);
  mxx::impl::get_displacements<unsigned_long>(&local_c8,&local_f8);
  uVar16 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  uVar17 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_e0,uVar16 + uVar17,(allocator_type *)&local_120);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_168,&local_98,&local_b0,
             local_e0.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f8,&local_c8,comm_01);
  local_180 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_01->m_rank];
  local_150 = (_Elt_pointer)(uVar16 + uVar17);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_158,local_100);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_160,local_100);
  pppVar3 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar2 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_178 = (comm *)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_170 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  for (pppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node; pppVar8 < pppVar3;
      pppVar8 = pppVar8 + 1) {
    operator_delete(pppVar8[1]);
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar5;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar2;
  lVar23 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)local_178;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_170;
  if (lVar23 != 0) {
    lVar23 = lVar23 >> 3;
    local_178 = (comm *)(uVar4 - 1);
    do {
      uVar16 = (long)local_178 + lVar23;
      lVar23 = lVar23 + -1;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar22 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (ppVar5[-1].first <= puVar22[lVar23]) break;
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_158->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar16;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_120.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar23];
      local_120.second = uVar16;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,&local_120);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_120.first;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar16;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar23 != 0);
  }
  if (local_180 != 0) {
    uVar9 = 0;
    local_178 = (comm *)(local_180 << 4);
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar21 = (ulong *)((long)&local_e0.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[~uVar9].first +
                         (long)local_178);
      uVar16 = *(unsigned_long *)
                ((long)&local_e0.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[~uVar9].second + (long)local_178);
      do {
        ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar5[-1].first <= *puVar21) break;
        ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_158->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar16;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_180);
  }
  pppVar3 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar2 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar15 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_178 = (comm *)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar22 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_158->first)->
              _M_impl).super__Vector_impl_data._M_start;
    ppVar6 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar13 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar6 == ppVar13) {
        puVar22[pppVar7[-1][0x1f].second - uVar4] = local_108;
        ppVar13 = pppVar7[-1];
        pppVar7 = pppVar7 + -1;
        ppVar6 = ppVar13 + 0x20;
      }
      else {
        puVar22[ppVar6[-1].second - uVar4] = local_108;
      }
      ppVar6 = ppVar6 + -1;
      ppVar15 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
    } while (ppVar6 != local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  for (; local_158 = ppVar15, pppVar8 < pppVar3; pppVar8 = pppVar8 + 1) {
    operator_delete(pppVar8[1]);
    ppVar15 = local_158;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar5;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar2;
  puVar22 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_158;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)local_178;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar22) {
    uVar9 = 0;
    do {
      uVar16 = uVar9 + uVar4;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        bVar25 = false;
        do {
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (ppVar5[-1].first <= puVar22[uVar9]) {
            if (!bVar25) {
              ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              if (puVar22[uVar9] == ppVar5[-1].first) {
                ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                }
                (local_160->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar16;
                if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
                }
                else {
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
                }
              }
            }
            break;
          }
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          (local_160->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar16;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          bVar25 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                   local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
        } while (!bVar25);
      }
      local_120.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar9];
      local_120.second = uVar16;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,&local_120);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_120.first;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar16;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar9 = uVar9 + 1;
      puVar22 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(in->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar22 >> 3)
            );
  }
  if (local_150 != (_Elt_pointer)local_180) {
    lVar23 = (long)local_150 - local_180;
    lVar24 = 0;
    local_180 = local_180 << 4;
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar21 = (ulong *)((long)&local_e0.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar24].first + local_180
                         );
      uVar16 = *(unsigned_long *)
                ((long)&local_e0.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar24].second + local_180);
      bVar25 = false;
      do {
        ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        uVar9 = *puVar21;
        if (ppVar5[-1].first <= uVar9) {
          if (!bVar25) {
            ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            if (uVar9 == ppVar5[-1].first) {
              ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              (local_160->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar16;
              if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
              }
              else {
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            }
          }
          break;
        }
        ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        (local_160->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar5[-1].second - uVar4] = uVar16;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        bVar25 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                 local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while (!bVar25);
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar23 + (ulong)(lVar23 == 0));
  }
  if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar22 = (local_160->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start;
    pppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar15 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar5 == ppVar15) {
        puVar22[pppVar8[-1][0x1f].second - uVar4] = local_108;
        ppVar15 = pppVar8[-1];
        pppVar8 = pppVar8 + -1;
        ppVar5 = ppVar15 + 0x20;
      }
      else {
        puVar22[ppVar5[-1].second - uVar4] = local_108;
      }
      ppVar5 = ppVar5 + -1;
    } while (ppVar5 != local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_168,&local_e0);
  if (local_e0.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1d8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}